

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp_scan.hpp
# Opt level: O2

void __thiscall
duckdb::ChimpGroupState<unsigned_int>::LoadLeadingZeros
          (ChimpGroupState<unsigned_int> *this,uint8_t *packed_data,idx_t leading_zero_block_size)

{
  byte bVar1;
  idx_t i;
  idx_t iVar2;
  LeadingZeroBuffer<false> local_38;
  
  local_38.current = 0;
  local_38.counter = 0;
  local_38.buffer = packed_data;
  for (iVar2 = 0; leading_zero_block_size != iVar2; iVar2 = iVar2 + 1) {
    bVar1 = LeadingZeroBuffer<false>::Extract(&local_38);
    this->leading_zeros[iVar2] =
         *(uint8_t *)((long)&ChimpConstants::Decompression::LEADING_REPRESENTATION + (ulong)bVar1);
  }
  this->max_leading_zeros_to_read = leading_zero_block_size;
  this->leading_zero_index = 0;
  return;
}

Assistant:

void LoadLeadingZeros(uint8_t *packed_data, idx_t leading_zero_block_size) {
#ifdef DEBUG
		idx_t flag_one_count = 0;
		for (idx_t i = 0; i < max_flags_to_read; i++) {
			flag_one_count += flags[1 + i] == ChimpConstants::Flags::LEADING_ZERO_LOAD;
		}
		// There are 8 leading zero values packed in one block, the block could be partially filled
		flag_one_count = AlignValue<idx_t, 8>(flag_one_count);
		D_ASSERT(flag_one_count == leading_zero_block_size);
#endif
		LeadingZeroBuffer<false> leading_zero_buffer;
		leading_zero_buffer.SetBuffer(packed_data);
		for (idx_t i = 0; i < leading_zero_block_size; i++) {
			leading_zeros[i] = ChimpConstants::Decompression::LEADING_REPRESENTATION[leading_zero_buffer.Extract()];
		}
		max_leading_zeros_to_read = leading_zero_block_size;
		leading_zero_index = 0;
	}